

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

ON_MappingChannel * __thiscall
ON_ObjectRenderingAttributes::MappingChannel
          (ON_ObjectRenderingAttributes *this,ON_UUID *plugin_id,ON_UUID *mapping_id)

{
  bool bVar1;
  ON_MappingRef *pOVar2;
  ON_MappingChannel *local_40;
  ON_MappingChannel *mc;
  int count;
  ON_MappingRef *mr;
  ON_UUID *mapping_id_local;
  ON_UUID *plugin_id_local;
  ON_ObjectRenderingAttributes *this_local;
  
  pOVar2 = MappingRef(this,plugin_id);
  if ((pOVar2 != (ON_MappingRef *)0x0) &&
     (mc._4_4_ = ON_SimpleArray<ON_MappingChannel>::Count(&pOVar2->m_mapping_channels), 0 < mc._4_4_
     )) {
    local_40 = ON_SimpleArray<ON_MappingChannel>::Array(&pOVar2->m_mapping_channels);
    while (mc._4_4_ != 0) {
      bVar1 = ::operator==(mapping_id,&local_40->m_mapping_id);
      if (bVar1) {
        return local_40;
      }
      local_40 = local_40 + 1;
      mc._4_4_ = mc._4_4_ + -1;
    }
  }
  return (ON_MappingChannel *)0x0;
}

Assistant:

const ON_MappingChannel* ON_ObjectRenderingAttributes::MappingChannel(
  const ON_UUID& plugin_id,
  const ON_UUID& mapping_id
  ) const
{
  const ON_MappingRef* mr = MappingRef(plugin_id);
  if ( mr )
  {
    int count;
    if ( (count = mr->m_mapping_channels.Count()) > 0 )
    {
      for ( const ON_MappingChannel* mc = mr->m_mapping_channels.Array(); count--; mc++ )
      {
        if ( mapping_id == mc->m_mapping_id )
          return mc;
      }
    }
  }
  return 0;
}